

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O2

void __thiscall
chaiscript::dispatch::
Dynamic_Proxy_Function_Impl<chaiscript::Boxed_Value_(*)(const_chaiscript::Function_Params_&)>::
~Dynamic_Proxy_Function_Impl
          (Dynamic_Proxy_Function_Impl<chaiscript::Boxed_Value_(*)(const_chaiscript::Function_Params_&)>
           *this)

{
  Dynamic_Proxy_Function::~Dynamic_Proxy_Function(&this->super_Dynamic_Proxy_Function);
  operator_delete(this,0x70);
  return;
}

Assistant:

Dynamic_Proxy_Function_Impl(Callable t_f,
                                  int t_arity = -1,
                                  std::shared_ptr<AST_Node> t_parsenode = AST_NodePtr(),
                                  Param_Types t_param_types = Param_Types(),
                                  Proxy_Function t_guard = Proxy_Function())
          : Dynamic_Proxy_Function(t_arity, std::move(t_parsenode), std::move(t_param_types), std::move(t_guard))
          , m_f(std::move(t_f)) {
      }